

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muse.c
# Opt level: O2

int use_misc(monst *mtmp,musable *m)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  monuse mVar4;
  obj *poVar5;
  undefined8 uVar6;
  bool bVar7;
  level *plVar8;
  boolean bVar9;
  schar sVar10;
  xchar tolev;
  int iVar11;
  uint uVar12;
  char *pcVar13;
  trap *trap;
  char *pcVar14;
  char *pcVar15;
  permonst *ppVar16;
  obj *poVar17;
  monuse mVar18;
  char nambuf [256];
  
  poVar5 = m->misc;
  iVar11 = precheck(mtmp,poVar5,m);
  if (iVar11 != 0) {
    return iVar11;
  }
  bVar1 = viz_array[mtmp->my][mtmp->mx];
  if (mtmp->wormno == '\0') {
    if ((bVar1 & 2) != 0) goto LAB_001f03d7;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f037c;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f0373;
    }
    else {
LAB_001f0373:
      if (ublindf == (obj *)0x0) goto LAB_001f042f;
LAB_001f037c:
      if (ublindf->oartifact != '\x1d') goto LAB_001f042f;
    }
    if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
       (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001f042f;
    bVar7 = false;
    if (((mtmp->data->mflags3 & 0x200) != 0) && ((bVar1 & 1) != 0)) goto LAB_001f03d7;
  }
  else {
    bVar9 = worm_known(level,mtmp);
    if (bVar9 == '\0') {
LAB_001f042f:
      bVar7 = false;
    }
    else {
LAB_001f03d7:
      uVar12 = *(uint *)&mtmp->field_0x60;
      if ((((uVar12 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((char)uVar12 < '\0') goto LAB_001f042f;
      }
      else {
        bVar7 = false;
        if (((char)uVar12 < '\0') || (bVar7 = false, ((youmonst.data)->mflags1 & 0x1000000) == 0))
        goto LAB_001f0431;
      }
      bVar7 = (u._1052_1_ & 0x20) == 0 && (uVar12 >> 9 & 1) == 0;
    }
  }
LAB_001f0431:
  mVar4 = m->has_misc;
  mVar18 = MUSE_WAN_TELEPORTATION_SELF;
  switch(mVar4) {
  case MUSE_POT_GAIN_LEVEL:
    mquaffmsg(mtmp,poVar5);
    if ((poVar5->field_0x4a & 1) == 0) {
      if (bVar7) {
        pcVar13 = Monnam(mtmp);
        pline("%s seems more experienced.",pcVar13);
        discover_object(299,'\x01','\x01');
      }
      m_useup(mtmp,poVar5);
      ppVar16 = grow_up(mtmp,(monst *)0x0);
      return 2 - (uint)(ppVar16 == (permonst *)0x0);
    }
    bVar9 = Can_rise_up(level,(int)mtmp->mx,(int)mtmp->my);
    if (bVar9 != '\0') {
      sVar10 = depth(&u.uz);
      get_level((d_level *)nambuf,sVar10 + -1);
      bVar9 = on_level((d_level *)nambuf,&u.uz);
      if (bVar9 == '\0') {
        if (bVar7) {
          pcVar13 = Monnam(mtmp);
          pcVar14 = ceiling((int)mtmp->mx,(int)mtmp->my);
          pline("%s rises up, through the %s!",pcVar13,pcVar14);
          if (((objects[299].field_0x10 & 1) == 0) && (objects[299].oc_uname == (char *)0x0)) {
            docall(poVar5);
          }
        }
        m_useup(mtmp,poVar5);
        tolev = ledger_no((d_level *)nambuf);
        migrate_to_level(mtmp,tolev,'\0',(coord *)0x0);
        return 2;
      }
    }
    if (bVar7) {
      pcVar13 = Monnam(mtmp);
      pline("%s looks uneasy.",pcVar13);
      if (((objects[299].field_0x10 & 1) == 0) && (objects[299].oc_uname == (char *)0x0)) {
        docall(poVar5);
      }
    }
    goto LAB_001f0f0a;
  case MUSE_WAN_MAKE_INVISIBLE:
  case MUSE_POT_INVISIBILITY:
    if (poVar5->otyp == 0x1c5) {
      mzapmsg(mtmp,poVar5,'\x01');
      poVar5->spe = poVar5->spe + -1;
    }
    else {
      mquaffmsg(mtmp,poVar5);
    }
    if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
      pcVar13 = mon_nam(mtmp);
    }
    else {
      pcVar13 = Monnam(mtmp);
    }
    strcpy(nambuf,pcVar13);
    mon_set_minvis(mtmp);
    if ((bVar7) && ((mtmp->field_0x60 & 2) != 0)) {
      if ((u.uprops[0xc].extrinsic == 0 && u.uprops[0xc].intrinsic == 0) &&
         (((youmonst.data)->mflags1 & 0x1000000) == 0)) {
        pline("Suddenly you cannot see %s.",nambuf);
      }
      else {
        pcVar13 = s_suffix(nambuf);
        pcVar14 = "strange";
        if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
          if (u.umonnum == u.umonster) {
            pcVar14 = "normal";
          }
          else {
            bVar9 = dmgtype(youmonst.data,0x24);
            pcVar14 = "strange";
            if (bVar9 == '\0') {
              pcVar14 = "normal";
            }
          }
        }
        pline("%s body takes on a %s transparency.",pcVar13,pcVar14);
      }
      discover_object((int)poVar5->otyp,'\x01','\x01');
    }
    if (poVar5->otyp != 0x135) {
      return 2;
    }
    if ((poVar5->field_0x4a & 1) != 0) {
      pcVar13 = noit_mon_nam(mtmp);
      pcVar13 = s_suffix(pcVar13);
      pline("For some reason, %s presence is known to you.",pcVar13);
      cls();
      plVar8 = level;
      cVar2 = mtmp->mx;
      cVar3 = mtmp->my;
      if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
         ((u.umonnum != u.umonster && (bVar9 = dmgtype(youmonst.data,0x24), bVar9 != '\0')))) {
        iVar11 = (int)mtmp->mnum;
      }
      else {
        iVar11 = display_rng(0x193);
      }
      dbuf_set(plVar8,(int)cVar2,(int)cVar3,(rm *)0x0,0,0,0,0,0,0,0,iVar11 + 1,0,0);
      display_self();
      pcVar13 = noit_mon_nam(mtmp);
      pline("You feel aggravated at %s.",pcVar13);
      (*windowprocs.win_pause)(P_MAP);
      doredraw();
      bVar9 = unconscious();
      if (bVar9 != '\0') {
        multi = -1;
        nomovemsg = "Aggravated, you are jolted into full consciousness.";
      }
      newsym((int)mtmp->mx,(int)mtmp->my);
      if (mtmp->wormno == '\0') {
        if ((viz_array[mtmp->my][mtmp->mx] & 2U) != 0) goto LAB_001f0d71;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f0c49;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f0c40;
        }
        else {
LAB_001f0c40:
          if (ublindf == (obj *)0x0) goto LAB_001f0dc0;
LAB_001f0c49:
          if (ublindf->oartifact != '\x1d') goto LAB_001f0dc0;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[mtmp->my][mtmp->mx] & 1U) != 0)) && ((mtmp->data->mflags3 & 0x200) != 0))
        goto LAB_001f0d71;
      }
      else {
        bVar9 = worm_known(level,mtmp);
        if (bVar9 != '\0') {
LAB_001f0d71:
          uVar12 = *(uint *)&mtmp->field_0x60;
          if ((((uVar12 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar12 & 0x280) == 0) goto LAB_001f0db1;
          }
          else if (((uVar12 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001f0db1:
            if ((u._1052_1_ & 0x20) == 0) goto LAB_001f0f0a;
          }
        }
      }
LAB_001f0dc0:
      if (((mtmp->data->mflags1 & 0x10000) == 0) &&
         ((poVar17 = which_armor(mtmp,4), poVar17 == (obj *)0x0 ||
          (poVar17 = which_armor(mtmp,4), poVar17->otyp != 0x4f)))) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001f0e0e;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001f0e09;
        }
        else {
LAB_001f0e09:
          if (ublindf != (obj *)0x0) {
LAB_001f0e0e:
            if (ublindf->oartifact == '\x1d') goto LAB_001f0ea8;
          }
          if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001f0f0a;
        }
LAB_001f0ea8:
        if ((u.uprops[0x19].extrinsic != 0) &&
           ((u.uprops[0x19].blocked == 0 &&
            (iVar11 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy), iVar11 < 0x41))))
        goto LAB_001f0f0a;
      }
      if ((u.uprops[0x42].intrinsic == 0) &&
         ((u.uprops[0x42].extrinsic == 0 && (bVar9 = match_warn_of_mon(mtmp), bVar9 == '\0')))) {
        map_invisible(mtmp->mx,mtmp->my);
      }
    }
    goto LAB_001f0f0a;
  case MUSE_POLY_TRAP:
    if (bVar7) {
      pcVar13 = Monnam(mtmp);
      pcVar14 = locomotion(mtmp->data,"jump");
      pcVar14 = makeplural(pcVar14);
      pline("%s deliberately %s onto a polymorph trap!",pcVar13,pcVar14);
    }
    if ((bVar1 & 2) != 0) {
      trap = t_at(level,trapx,trapy);
      seetrap(trap);
    }
    remove_monster(level,(int)mtmp->mx,(int)mtmp->my);
    newsym((int)mtmp->mx,(int)mtmp->my);
    place_monster(mtmp,trapx,trapy);
    if (mtmp->wormno != '\0') {
      worm_move(mtmp);
    }
    newsym(trapx,trapy);
    newcham(level,mtmp,(permonst *)0x0,'\0','\0');
    break;
  case MUSE_WAN_POLYMORPH:
    mzapmsg(mtmp,poVar5,'\x01');
    poVar5->spe = poVar5->spe + -1;
    plVar8 = level;
    ppVar16 = muse_newcham_mon(mtmp);
    newcham(plVar8,mtmp,ppVar16,'\x01','\0');
    if (bVar7) {
      discover_object(0x1c9,'\x01','\x01');
    }
    break;
  case MUSE_POT_SPEED:
    mquaffmsg(mtmp,poVar5);
    mon_adjust_speed(mtmp,1,poVar5);
    goto LAB_001f0f0a;
  case MUSE_WAN_SPEED_MONSTER:
    mzapmsg(mtmp,poVar5,'\x01');
    poVar5->spe = poVar5->spe + -1;
    mon_adjust_speed(mtmp,1,poVar5);
    break;
  case MUSE_BULLWHIP:
    if (uwep == (obj *)0x0) {
      return 0;
    }
    uVar12 = mt_random();
    if (uVar12 % 5 != 0) {
      return 0;
    }
    pcVar13 = "A whip";
    if (bVar7) {
      pcVar13 = "The bullwhip";
    }
    uVar12 = mt_random();
    poVar5 = uwep;
    pcVar14 = xname(uwep);
    pcVar14 = the(pcVar14);
    strcpy(nambuf,pcVar14);
    pcVar14 = body_part(6);
    if (((byte)(poVar5->oclass | 4U) == 6) && ((objects[poVar5->otyp].field_0x11 & 1) != 0)) {
      pcVar14 = makeplural(pcVar14);
    }
    if (bVar7) {
      pcVar15 = Monnam(mtmp);
      pline("%s flicks a bullwhip towards your %s!",pcVar15,pcVar14);
    }
    if (poVar5->otyp == 0x216) {
      pline("%s fails to wrap around %s.",pcVar13,nambuf);
    }
    else {
      pline("%s wraps around %s you\'re wielding!",pcVar13,nambuf);
      iVar11 = welded(poVar5);
      if (iVar11 == 0) {
        uVar12 = uVar12 & 3;
        if (uVar12 == 3) {
          bVar9 = hates_silver(mtmp->data);
          if ((bVar9 == '\0') || ((*(ushort *)&objects[poVar5->otyp].field_0x11 & 0x1f0) != 0xe0)) {
            freeinv(poVar5);
            uwepgone();
            pcVar13 = Monnam(mtmp);
            pline("%s snatches %s!",pcVar13,nambuf);
            mpickobj(mtmp,poVar5);
          }
          else {
            freeinv(poVar5);
            uwepgone();
LAB_001f0f57:
            pcVar13 = Monnam(mtmp);
            pcVar14 = surface((int)u.ux,(int)u.uy);
            pline("%s yanks %s to the %s!",pcVar13,nambuf,pcVar14);
            dropy(poVar5);
          }
        }
        else {
          if (uVar12 == 0) goto LAB_001f0cfe;
          freeinv(poVar5);
          uwepgone();
          if (uVar12 == 2) goto LAB_001f0f57;
          if (uVar12 == 1) {
            pcVar13 = Monnam(mtmp);
            pline("%s yanks %s from your %s!",pcVar13,nambuf,pcVar14);
            place_object(poVar5,level,(int)mtmp->mx,(int)mtmp->my);
          }
        }
      }
      else {
        if (poVar5->quan < 2) {
          pcVar13 = "It is";
          if (poVar5->oartifact == '\x1d') {
            pcVar13 = "They are";
          }
        }
        else {
          pcVar13 = "They are";
        }
        uVar6 = 0x2e;
        if ((poVar5->field_0x4a & 0x40) == 0) {
          uVar6 = 0x21;
        }
        pline("%s welded to your %s%c",pcVar13,pcVar14,uVar6);
LAB_001f0cfe:
        pline("The whip slips free.");
      }
    }
    mVar18 = MUSE_SCR_TELEPORTATION;
    break;
  case MUSE_POT_POLYMORPH:
    mquaffmsg(mtmp,poVar5);
    if (bVar7) {
      pcVar13 = Monnam(mtmp);
      pline("%s suddenly mutates!",pcVar13);
    }
    plVar8 = level;
    ppVar16 = muse_newcham_mon(mtmp);
    newcham(plVar8,mtmp,ppVar16,'\0','\0');
    if ((bool)(poVar5 != (obj *)0x0 & bVar7)) {
      discover_object(0x13a,'\x01','\x01');
    }
LAB_001f0f0a:
    m_useup(mtmp,poVar5);
    break;
  default:
    mVar18 = mVar4;
    if (mVar4 != MUSE_NONE) {
      pcVar13 = Monnam(mtmp);
      mVar18 = MUSE_NONE;
      warning("%s wanted to perform action %d?",pcVar13,(ulong)m->has_misc);
    }
  }
  return mVar18;
}

Assistant:

int use_misc(struct monst *mtmp, struct musable *m)
{
	int i;
	struct obj *otmp = m->misc;
	boolean vis, vismon, oseen;
	char nambuf[BUFSZ];

	if ((i = precheck(mtmp, otmp, m)) != 0) return i;
	vis = cansee(mtmp->mx, mtmp->my);
	vismon = canseemon(level, mtmp);
	oseen = otmp && vismon;

	switch(m->has_misc) {
	case MUSE_POT_GAIN_LEVEL:
		mquaffmsg(mtmp, otmp);
		if (otmp->cursed) {
		    if (Can_rise_up(level, mtmp->mx, mtmp->my)) {
			int tolev = depth(&u.uz)-1;
			d_level tolevel;

			get_level(&tolevel, tolev);
			/* insurance against future changes... */
			if (on_level(&tolevel, &u.uz)) goto skipmsg;
			if (vismon) {
			    pline("%s rises up, through the %s!",
				  Monnam(mtmp), ceiling(mtmp->mx, mtmp->my));
			    if (!objects[POT_GAIN_LEVEL].oc_name_known
			      && !objects[POT_GAIN_LEVEL].oc_uname)
				docall(otmp);
			}
			m_useup(mtmp, otmp);
			migrate_to_level(mtmp, ledger_no(&tolevel),
					 MIGR_RANDOM, NULL);
			return 2;
		    } else {
skipmsg:
			if (vismon) {
			    pline("%s looks uneasy.", Monnam(mtmp));
			    if (!objects[POT_GAIN_LEVEL].oc_name_known
			      && !objects[POT_GAIN_LEVEL].oc_uname)
				docall(otmp);
			}
			m_useup(mtmp, otmp);
			return 2;
		    }
		}
		if (vismon) pline("%s seems more experienced.", Monnam(mtmp));
		if (oseen) makeknown(POT_GAIN_LEVEL);
		m_useup(mtmp, otmp);
		if (!grow_up(mtmp,NULL)) return 1;
			/* grew into genocided monster */
		return 2;
	case MUSE_WAN_MAKE_INVISIBLE:
	case MUSE_POT_INVISIBILITY:
		if (otmp->otyp == WAN_MAKE_INVISIBLE) {
		    mzapmsg(mtmp, otmp, TRUE);
		    otmp->spe--;
		} else
		    mquaffmsg(mtmp, otmp);
		/* format monster's name before altering its visibility */
		strcpy(nambuf, See_invisible ? Monnam(mtmp) : mon_nam(mtmp));
		mon_set_minvis(mtmp);
		if (vismon && mtmp->minvis) {	/* was seen, now invisible */
		    if (See_invisible)
			pline("%s body takes on a %s transparency.",
			      s_suffix(nambuf),
			      Hallucination ? "normal" : "strange");
		    else
			pline("Suddenly you cannot see %s.", nambuf);
		    if (oseen) makeknown(otmp->otyp);
		}
		if (otmp->otyp == POT_INVISIBILITY) {
		    if (otmp->cursed) you_aggravate(mtmp);
		    m_useup(mtmp, otmp);
		}
		return 2;
	case MUSE_WAN_SPEED_MONSTER:
		mzapmsg(mtmp, otmp, TRUE);
		otmp->spe--;
		mon_adjust_speed(mtmp, 1, otmp);
		return 2;
	case MUSE_POT_SPEED:
		mquaffmsg(mtmp, otmp);
		/* note difference in potion effect due to substantially
		   different methods of maintaining speed ratings:
		   player's character becomes "very fast" temporarily;
		   monster becomes "one stage faster" permanently */
		mon_adjust_speed(mtmp, 1, otmp);
		m_useup(mtmp, otmp);
		return 2;
	case MUSE_WAN_POLYMORPH:
		mzapmsg(mtmp, otmp, TRUE);
		otmp->spe--;
		newcham(level, mtmp, muse_newcham_mon(mtmp), TRUE, FALSE);
		if (oseen) makeknown(WAN_POLYMORPH);
		return 2;
	case MUSE_POT_POLYMORPH:
		mquaffmsg(mtmp, otmp);
		if (vismon) pline("%s suddenly mutates!", Monnam(mtmp));
		newcham(level, mtmp, muse_newcham_mon(mtmp), FALSE, FALSE);
		if (oseen) makeknown(POT_POLYMORPH);
		m_useup(mtmp, otmp);
		return 2;
	case MUSE_POLY_TRAP:
		if (vismon)
		    pline("%s deliberately %s onto a polymorph trap!",
			Monnam(mtmp),
			makeplural(locomotion(mtmp->data, "jump")));
		if (vis) seetrap(t_at(level, trapx,trapy));

		/*  don't use rloc() due to worms */
		remove_monster(level, mtmp->mx, mtmp->my);
		newsym(mtmp->mx, mtmp->my);
		place_monster(mtmp, trapx, trapy);
		if (mtmp->wormno) worm_move(mtmp);
		newsym(trapx, trapy);

		newcham(level, mtmp, NULL, FALSE, FALSE);
		return 2;
	case MUSE_BULLWHIP:
		/* attempt to disarm hero */
		if (uwep && !rn2(5)) {
		    const char *The_whip = vismon ? "The bullwhip" : "A whip";
		    int where_to = rn2(4);
		    struct obj *obj = uwep;
		    const char *hand;
		    char the_weapon[BUFSZ];

		    strcpy(the_weapon, the(xname(obj)));
		    hand = body_part(HAND);
		    if (bimanual(obj)) hand = makeplural(hand);

		    if (vismon)
			pline("%s flicks a bullwhip towards your %s!",
			      Monnam(mtmp), hand);
		    if (obj->otyp == HEAVY_IRON_BALL) {
			pline("%s fails to wrap around %s.",
			      The_whip, the_weapon);
			return 1;
		    }
		    pline("%s wraps around %s you're wielding!",
			  The_whip, the_weapon);
		    if (welded(obj)) {
			pline("%s welded to your %s%c",
			      !is_plural(obj) ? "It is" : "They are",
			      hand, !obj->bknown ? '!' : '.');
			/* obj->bknown = 1; */ /* welded() takes care of this */
			where_to = 0;
		    }
		    if (!where_to) {
			pline("The whip slips free.");  /* not `The_whip' */
			return 1;
		    } else if (where_to == 3 && hates_silver(mtmp->data) &&
			    objects[obj->otyp].oc_material == SILVER) {
			/* this monster won't want to catch a silver
			   weapon; drop it at hero's feet instead */
			where_to = 2;
		    }
		    freeinv(obj);
		    uwepgone();
		    switch (where_to) {
			case 1:		/* onto floor beneath mon */
			    pline("%s yanks %s from your %s!", Monnam(mtmp),
				  the_weapon, hand);
			    place_object(obj, level, mtmp->mx, mtmp->my);
			    break;
			case 2:		/* onto floor beneath you */
			    pline("%s yanks %s to the %s!", Monnam(mtmp),
				  the_weapon, surface(u.ux, u.uy));
			    dropy(obj);
			    break;
			case 3:		/* into mon's inventory */
			    pline("%s snatches %s!", Monnam(mtmp),
				  the_weapon);
			    mpickobj(mtmp,obj);
			    break;
		    }
		    return 1;
		}
		return 0;
	case 0: return 0; /* i.e. an exploded wand */
	default: warning("%s wanted to perform action %d?", Monnam(mtmp),
			 m->has_misc);
		break;
	}
	return 0;
}